

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

void __thiscall helics::MultiBroker::transmit(MultiBroker *this,route_id rid,ActionMessage *cmd)

{
  bool bVar1;
  reference this_00;
  BaseType in_ESI;
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  *in_RDI;
  pair<helics::route_id,_int> *rtable;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  *__range2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  route_id rVar2;
  vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  *in_stack_ffffffffffffffc0;
  route_id rid_00;
  __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
  local_30;
  pointer *local_28;
  BaseType local_20;
  undefined4 local_1c;
  route_id local_4;
  
  local_1c = 0;
  local_4.rid = in_ESI;
  bVar1 = route_id::operator==(&local_4,(route_id)0x0);
  if ((bVar1) ||
     (bVar1 = CLI::std::
              vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
              ::empty(in_stack_ffffffffffffffc0), bVar1)) {
    rVar2.rid = (BaseType)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                        *)0x1f447d);
    if (bVar1) {
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )0x1f4493);
      local_20 = local_4.rid;
      CommsInterface::transmit
                ((CommsInterface *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 rVar2,(ActionMessage *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  else {
    local_28 = &in_RDI[0xa7].
                super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_30._M_current =
         (pair<helics::route_id,_int> *)
         CLI::std::
         vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
         ::begin(in_RDI);
    CLI::std::
    vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
    end(in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                             ((__normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (__normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                               *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
                ::operator*(&local_30);
      rVar2.rid = local_4.rid;
      bVar1 = route_id::operator==(&this_00->first,local_4);
      if (bVar1) {
        if (this_00->second == 0) {
          CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
          ::operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                        *)0x1f4543);
          CommsInterface::transmit
                    ((CommsInterface *)CONCAT44(rVar2.rid,local_4.rid),
                     (route_id)(BaseType)((ulong)this_00 >> 0x20),
                     (ActionMessage *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
          ;
          return;
        }
        CLI::std::
        vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
        ::operator[]((vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                      *)&in_RDI[0x9a].
                         super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)(this_00->second + -1));
        rid_00.rid = (BaseType)((ulong)this_00 >> 0x20);
        CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
        operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                    *)0x1f4584);
        CommsInterface::transmit
                  ((CommsInterface *)CONCAT44(rVar2.rid,in_stack_ffffffffffffffb8),rid_00,
                   (ActionMessage *)CONCAT44(local_4.rid,in_stack_ffffffffffffffb0));
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<helics::route_id,_int>_*,_std::vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void MultiBroker::transmit(route_id rid, ActionMessage&& cmd)
{
    if (rid == parent_route_id || comms.empty()) {
        if (masterComm) {
            masterComm->transmit(rid, cmd);
            return;
        }
    } else {
        for (const auto& rtable : routingTable) {
            if (rtable.first == rid) {
                if (rtable.second == 0) {
                    masterComm->transmit(rid, cmd);
                } else {
                    comms[rtable.second - 1]->transmit(rid, cmd);
                }
                return;
            }
        }
    }
}